

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall CLI::App::_move_to_missing(App *this,Classifier val_type,string *val)

{
  pointer psVar1;
  App *pAVar2;
  iterator __begin1;
  pointer psVar3;
  Classifier local_4;
  
  pAVar2 = this;
  if (this->allow_extras_ == false) {
    psVar3 = (this->subcommands_).
             super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->subcommands_).
             super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar3 != psVar1) {
      while ((pAVar2 = this, psVar3 != psVar1 &&
             ((pAVar2 = (psVar3->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
              (pAVar2->name_)._M_string_length != 0 || (pAVar2->allow_extras_ == false))))) {
        psVar3 = psVar3 + 1;
      }
    }
  }
  ::std::
  vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
  ::emplace_back<CLI::detail::Classifier&,std::__cxx11::string_const&>
            ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
              *)&pAVar2->missing_,&local_4,val);
  return;
}

Assistant:

CLI11_INLINE void App::_move_to_missing(detail::Classifier val_type, const std::string &val) {
    if(allow_extras_ || subcommands_.empty()) {
        missing_.emplace_back(val_type, val);
        return;
    }
    // allow extra arguments to be places in an option group if it is allowed there
    for(auto &subc : subcommands_) {
        if(subc->name_.empty() && subc->allow_extras_) {
            subc->missing_.emplace_back(val_type, val);
            return;
        }
    }
    // if we haven't found any place to put them yet put them in missing
    missing_.emplace_back(val_type, val);
}